

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ecdsa_signature_serialize_der
              (secp256k1_context *ctx,uchar *output,size_t *outputlen,secp256k1_ecdsa_signature *sig
              )

{
  uchar *puVar1;
  char *pcVar2;
  ulong uVar3;
  char *__src;
  size_t __n;
  ulong uVar4;
  size_t __n_00;
  uchar *__src_00;
  char local_d8 [48];
  uchar r_1 [33];
  secp256k1_scalar s;
  secp256k1_scalar r;
  
  pcVar2 = local_d8;
  r.d[0] = *(uint64_t *)sig->data;
  r.d[1] = *(uint64_t *)(sig->data + 8);
  r.d[2] = *(uint64_t *)(sig->data + 0x10);
  r.d[3] = *(uint64_t *)(sig->data + 0x18);
  s.d[0] = *(uint64_t *)(sig->data + 0x20);
  s.d[1] = *(uint64_t *)(sig->data + 0x28);
  s.d[2] = *(uint64_t *)(sig->data + 0x30);
  s.d[3] = *(uint64_t *)(sig->data + 0x38);
  r_1[0x20] = '\0';
  r_1[0x10] = '\0';
  r_1[0x11] = '\0';
  r_1[0x12] = '\0';
  r_1[0x13] = '\0';
  r_1[0x14] = '\0';
  r_1[0x15] = '\0';
  r_1[0x16] = '\0';
  r_1[0x17] = '\0';
  r_1[0x18] = '\0';
  r_1[0x19] = '\0';
  r_1[0x1a] = '\0';
  r_1[0x1b] = '\0';
  r_1[0x1c] = '\0';
  r_1[0x1d] = '\0';
  r_1[0x1e] = '\0';
  r_1[0x1f] = '\0';
  r_1[0] = '\0';
  r_1[1] = '\0';
  r_1[2] = '\0';
  r_1[3] = '\0';
  r_1[4] = '\0';
  r_1[5] = '\0';
  r_1[6] = '\0';
  r_1[7] = '\0';
  r_1[8] = '\0';
  r_1[9] = '\0';
  r_1[10] = '\0';
  r_1[0xb] = '\0';
  r_1[0xc] = '\0';
  r_1[0xd] = '\0';
  r_1[0xe] = '\0';
  r_1[0xf] = '\0';
  local_d8[0x20] = 0;
  local_d8[0x10] = '\0';
  local_d8[0x11] = '\0';
  local_d8[0x12] = '\0';
  local_d8[0x13] = '\0';
  local_d8[0x14] = '\0';
  local_d8[0x15] = '\0';
  local_d8[0x16] = '\0';
  local_d8[0x17] = '\0';
  local_d8[0x18] = '\0';
  local_d8[0x19] = '\0';
  local_d8[0x1a] = '\0';
  local_d8[0x1b] = '\0';
  local_d8[0x1c] = '\0';
  local_d8[0x1d] = '\0';
  local_d8[0x1e] = '\0';
  local_d8[0x1f] = '\0';
  local_d8[0] = '\0';
  local_d8[1] = '\0';
  local_d8[2] = '\0';
  local_d8[3] = '\0';
  local_d8[4] = '\0';
  local_d8[5] = '\0';
  local_d8[6] = '\0';
  local_d8[7] = '\0';
  local_d8[8] = '\0';
  local_d8[9] = '\0';
  local_d8[10] = '\0';
  local_d8[0xb] = '\0';
  local_d8[0xc] = '\0';
  local_d8[0xd] = '\0';
  local_d8[0xe] = '\0';
  local_d8[0xf] = '\0';
  secp256k1_scalar_get_b32(r_1 + 1,&r);
  secp256k1_scalar_get_b32((uchar *)(local_d8 + 1),&s);
  uVar4 = 0x21;
  for (puVar1 = r_1;
      ((__n_00 = 1, __src_00 = r_1 + 0x20, 1 < uVar4 &&
       (__n_00 = uVar4, __src_00 = puVar1, *puVar1 == '\0')) && (-1 < (char)puVar1[1]));
      puVar1 = puVar1 + 1) {
    uVar4 = uVar4 - 1;
  }
  uVar4 = 0x21;
  for (; ((__src = local_d8 + 0x20, __n = 1, 1 < uVar4 &&
          (__src = pcVar2, __n = uVar4, *pcVar2 == '\0')) && (-1 < pcVar2[1])); pcVar2 = pcVar2 + 1)
  {
    uVar4 = uVar4 - 1;
  }
  uVar3 = __n + __n_00 + 6;
  uVar4 = *outputlen;
  *outputlen = uVar3;
  if (uVar3 <= uVar4) {
    *output = '0';
    output[1] = (uchar)__n + (uchar)__n_00 + '\x04';
    output[2] = '\x02';
    output[3] = (uchar)__n_00;
    memcpy(output + 4,__src_00,__n_00);
    output[__n_00 + 4] = '\x02';
    output[__n_00 + 5] = (uchar)__n;
    memcpy(output + __n_00 + 6,__src,__n);
  }
  return (uint)(uVar3 <= uVar4);
}

Assistant:

int secp256k1_ecdsa_signature_serialize_der(const secp256k1_context* ctx, unsigned char *output, size_t *outputlen, const secp256k1_ecdsa_signature* sig) {
    secp256k1_scalar r, s;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(outputlen != NULL);
    ARG_CHECK(sig != NULL);

    secp256k1_ecdsa_signature_load(ctx, &r, &s, sig);
    return secp256k1_ecdsa_sig_serialize(output, outputlen, &r, &s);
}